

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_builder.cc
# Opt level: O0

void __thiscall
leveldb::TableBuilder::WriteBlock(TableBuilder *this,BlockBuilder *block,BlockHandle *handle)

{
  Rep *pRVar1;
  bool bVar2;
  char *input;
  size_t sVar3;
  ulong uVar4;
  size_t sVar5;
  Slice local_68;
  string *local_58;
  string *compressed;
  undefined1 auStack_48 [4];
  CompressionType type;
  Slice block_contents;
  Slice raw;
  Rep *r;
  BlockHandle *handle_local;
  BlockBuilder *block_local;
  TableBuilder *this_local;
  
  bVar2 = ok(this);
  if (!bVar2) {
    __assert_fail("ok()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_builder.cc"
                  ,0x92,"void leveldb::TableBuilder::WriteBlock(BlockBuilder *, BlockHandle *)");
  }
  pRVar1 = this->rep_;
  join_0x00000010_0x00000000_ = BlockBuilder::Finish(block);
  Slice::Slice((Slice *)auStack_48);
  compressed._4_4_ = (pRVar1->options).compression;
  if (compressed._4_4_ == kNoCompression) {
    _auStack_48 = (char *)block_contents.size_;
    block_contents.data_ = raw.data_;
  }
  else if (compressed._4_4_ == kSnappyCompression) {
    local_58 = &pRVar1->compressed_output;
    input = Slice::data((Slice *)&block_contents.size_);
    sVar3 = Slice::size((Slice *)&block_contents.size_);
    bVar2 = port::Snappy_Compress(input,sVar3,local_58);
    if (bVar2) {
      uVar4 = std::__cxx11::string::size();
      sVar3 = Slice::size((Slice *)&block_contents.size_);
      sVar5 = Slice::size((Slice *)&block_contents.size_);
      if (uVar4 < sVar3 - (sVar5 >> 3)) {
        Slice::Slice(&local_68,local_58);
        _auStack_48 = local_68.data_;
        block_contents.data_ = (char *)local_68.size_;
        goto LAB_0013774a;
      }
    }
    _auStack_48 = (char *)block_contents.size_;
    block_contents.data_ = raw.data_;
    compressed._4_4_ = kNoCompression;
  }
LAB_0013774a:
  WriteRawBlock(this,(Slice *)auStack_48,compressed._4_4_,handle);
  std::__cxx11::string::clear();
  BlockBuilder::Reset(block);
  return;
}

Assistant:

void TableBuilder::WriteBlock(BlockBuilder* block, BlockHandle* handle) {
  // File format contains a sequence of blocks where each block has:
  //    block_data: uint8[n]
  //    type: uint8
  //    crc: uint32
  assert(ok());
  Rep* r = rep_;
  Slice raw = block->Finish();

  Slice block_contents;
  CompressionType type = r->options.compression;
  // TODO(postrelease): Support more compression options: zlib?
  switch (type) {
    case kNoCompression:
      block_contents = raw;
      break;

    case kSnappyCompression: {
      std::string* compressed = &r->compressed_output;
      if (port::Snappy_Compress(raw.data(), raw.size(), compressed) &&
          compressed->size() < raw.size() - (raw.size() / 8u)) {
        block_contents = *compressed;
      } else {
        // Snappy not supported, or compressed less than 12.5%, so just
        // store uncompressed form
        block_contents = raw;
        type = kNoCompression;
      }
      break;
    }
  }
  WriteRawBlock(block_contents, type, handle);
  r->compressed_output.clear();
  block->Reset();
}